

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O2

void __thiscall
adios2::format::ChunkV::ChunkV
          (ChunkV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize,
          size_t ChunkSize)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)type);
  BufferV::BufferV(&this->super_BufferV,&local_50,AlwaysCopy,MemAlign,MemBlockSize);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_BufferV)._vptr_BufferV = (_func_int **)&PTR__ChunkV_00821c60;
  this->m_ChunkSize = ChunkSize;
  (this->m_Chunks).
  super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Chunks).
  super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Chunks).
  super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_TailChunkPos = 0;
  this->m_TailChunk = (Chunk *)0x0;
  return;
}

Assistant:

ChunkV::ChunkV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
               const size_t MemBlockSize, const size_t ChunkSize)
: BufferV(type, AlwaysCopy, MemAlign, MemBlockSize), m_ChunkSize(ChunkSize)
{
}